

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c
# Opt level: O0

void draw_tilemap_reg(dbg_layer_t layer)

{
  ushort uVar1;
  int iVar2;
  int x_1;
  reg_se_t se;
  int se_number;
  int tilemap_y;
  int tilemap_x;
  int screenblock_number;
  int x;
  int y;
  gba_color_t line [1024];
  uint32_t screen_base_addr;
  uint32_t character_base_addr;
  BGCNT_t *bgcnt;
  int tilemap_size_y;
  int tilemap_size_x;
  uint16_t *warr;
  int tile_y;
  int tile_x;
  uint32_t palette_address;
  uint8_t tile;
  uint32_t tile_address;
  int in_tile_offset;
  int tile_size;
  int in_tile_offset_divisor;
  uint16_t *warr_1;
  int local_8f8;
  dbg_layer_t in_stack_fffffffffffff70c;
  dbg_layer_t in_stack_fffffffffffff710;
  int local_8e8;
  undefined4 local_8e4;
  uint local_8d4;
  int local_8d0;
  int local_8cc;
  ushort local_8c8 [1024];
  int local_c8;
  int local_c4;
  BGCNT_t *local_c0;
  int local_b4;
  int local_b0;
  uint8_t *local_a8;
  int local_9c;
  uint8_t *local_98;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  undefined1 local_75;
  int local_74;
  ushort *local_70;
  gba_ppu_t *local_68;
  undefined4 local_60;
  int local_5c;
  byte local_55;
  uint local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  undefined1 local_35;
  int local_34;
  ushort *local_30;
  uint local_28;
  uint local_24;
  gba_ppu_t *local_20;
  uint8_t *local_18;
  int local_c;
  uint8_t *local_8;
  
  local_b0 = get_tilemap_x(in_stack_fffffffffffff710);
  local_b4 = get_tilemap_y(in_stack_fffffffffffff710);
  local_c0 = get_bgcnt(in_stack_fffffffffffff70c);
  local_c4 = (uint)(local_c0->raw >> 2 & 3) << 0xe;
  local_c8 = (uint)(local_c0->raw >> 8 & 0x1f) << 0xb;
  memset(dbg_tilemap,0,0x400000);
  for (local_8cc = 0; local_8cc < 0x400; local_8cc = local_8cc + 1) {
    for (local_8d0 = 0; local_8d0 < 0x400; local_8d0 = local_8d0 + 1) {
      if ((local_b0 < local_8d0) || (local_b4 < local_8cc)) {
        local_8c8[local_8d0] = local_8c8[local_8d0] & 0xffe0;
        local_8c8[local_8d0] = local_8c8[local_8d0] & 0xfc1f;
        local_8c8[local_8d0] = local_8c8[local_8d0] & 0x83ff;
      }
      else {
        switch(local_c0->raw >> 0xe) {
        case 0:
          local_8d4 = 0;
          break;
        case 1:
          local_8d4 = (uint)(0xff < local_8d0 % 0x200);
          break;
        case 2:
          local_8d4 = (uint)(0xff < local_8cc % 0x200);
          break;
        case 3:
          iVar2 = 0;
          if (0xff < local_8cc % 0x200) {
            iVar2 = 2;
          }
          local_8d4 = iVar2 + (uint)(0xff < local_8d0 % 0x200);
          break;
        default:
          fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                  "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/graphics/debug.c"
                  ,0x155);
          fprintf(_stderr,"Unimplemented screen size: %d\n\x1b[0;m",(ulong)(local_c0->raw >> 0xe));
          exit(1);
        }
        local_80 = local_8d0 % 0x100;
        local_84 = local_8cc % 0x100;
        local_a8 = ppu->vram;
        local_9c = local_c8 + local_8d4 * 0x800 + (local_80 / 8 + (local_84 / 8) * 0x20) * 2;
        uVar1 = *(ushort *)(local_a8 + ((long)local_9c & 0xfffffffffffffffe));
        local_8e4 = CONCAT22(local_8e4._2_2_,uVar1);
        local_75 = (local_c0->raw >> 7 & 1) != 0;
        local_60 = local_8e4;
        local_68 = ppu;
        local_70 = local_8c8;
        local_74 = local_8d0;
        local_7c = local_c4;
        local_88 = local_80 % 8;
        if ((uVar1 >> 10 & 1) != 0) {
          local_88 = 7 - local_88;
        }
        local_8c = local_84 % 8;
        if ((uVar1 >> 0xb & 1) != 0) {
          local_8c = 7 - local_8c;
        }
        local_20 = ppu;
        local_24 = (uint)(uVar1 & 0x3ff);
        local_28 = (uint)(uVar1 >> 0xc);
        local_34 = local_8d0;
        local_3c = local_c4;
        local_40 = local_88;
        local_44 = local_8c;
        local_48 = 2;
        if ((bool)local_75) {
          local_48 = 1;
        }
        local_4c = 0x20;
        if ((bool)local_75) {
          local_4c = 0x40;
        }
        local_50 = local_88 + local_8c * 8;
        local_54 = local_50 / local_48 + local_c4 + local_24 * local_4c;
        local_55 = ppu->vram[local_54];
        if ((bool)local_75) {
          local_8f8 = (uint)local_55 << 1;
        }
        else {
          local_55 = (byte)((int)(uint)local_55 >> ((byte)(local_50 % 2 << 2) & 0x1f)) & 0xf;
          local_8f8 = local_28 * 0x20 + (uint)local_55 * 2;
        }
        local_5c = local_8f8;
        local_18 = ppu->pram;
        local_c = local_8f8;
        local_70[local_8d0] = *(ushort *)(local_18 + local_8f8);
        local_70[local_8d0] = local_70[local_8d0] & 0x7fff | (ushort)(local_55 == 0) << 0xf;
        local_98 = local_a8;
        local_35 = local_75;
        local_30 = local_70;
        local_8 = local_18;
      }
    }
    for (local_8e8 = 0; local_8e8 < 0x400; local_8e8 = local_8e8 + 1) {
      *(byte *)((long)local_8cc * 0x1000 + 0x18c421 + (long)local_8e8 * 4) =
           (char)local_8c8[local_8e8] << 3 | (byte)local_8c8[local_8e8] & 7;
      *(byte *)((long)local_8cc * 0x1000 + 0x18c422 + (long)local_8e8 * 4) =
           (char)(local_8c8[local_8e8] >> 5) << 3 | (byte)(local_8c8[local_8e8] >> 5) & 7;
      *(byte *)((long)local_8cc * 0x1000 + 0x18c423 + (long)local_8e8 * 4) =
           (byte)(local_8c8[local_8e8] >> 10) << 3 | (byte)(local_8c8[local_8e8] >> 10) & 7;
      dbg_tilemap[local_8cc][local_8e8].a = 0xff;
    }
  }
  SDL_UpdateTexture(dbg_tilemap_texture,0,dbg_tilemap,0x1000);
  return;
}

Assistant:

void draw_tilemap_reg(dbg_layer_t layer) {
    int tilemap_size_x = get_tilemap_x(layer);
    int tilemap_size_y = get_tilemap_y(layer);
    BGCNT_t* bgcnt = get_bgcnt(layer);

    word character_base_addr = bgcnt->character_base_block * CHARBLOCK_SIZE;
    word screen_base_addr = bgcnt->screen_base_block * SCREENBLOCK_SIZE;

    memset(dbg_tilemap, 0, sizeof(color_t) * MAX_TILEMAP_SIZE_X * MAX_TILEMAP_SIZE_Y);

    gba_color_t line[MAX_TILEMAP_SIZE_X];
    for (int y = 0; y < MAX_TILEMAP_SIZE_Y; y++) {
        for (int x = 0; x < MAX_TILEMAP_SIZE_X; x++) {
            if (x > tilemap_size_x || y > tilemap_size_y) {
                line[x].r = 0;
                line[x].g = 0;
                line[x].b = 0;
                continue;
            }
            int screenblock_number;
            switch (bgcnt->screen_size) {
                case 0:
                    // 0
                    screenblock_number = 0;
                    break;
                case 1:
                    // 0 1
                    screenblock_number = (x % 512) > 255 ? 1 : 0;
                    break;
                case 2:
                    // 0
                    // 1
                    screenblock_number = (y % 512) > 255 ? 1 : 0;
                    break;
                case 3:
                    // 0 1
                    // 2 3
                    screenblock_number = (x % 512) > 255 ? 1 : 0;
                    screenblock_number += (y % 512) > 255 ? 2 : 0;
                    break;
                default:
                    logfatal("Unimplemented screen size: %d", bgcnt->screen_size);

            }
            int tilemap_x = x % 256;
            int tilemap_y = y % 256;

            int se_number = (tilemap_x / 8) + (tilemap_y / 8) * 32;
            reg_se_t se;
            se.raw = half_from_byte_array(ppu->vram, (screen_base_addr + screenblock_number * SCREENBLOCK_SIZE + se_number * 2));
            dbg_render_screenentry(ppu, &line, x, se, bgcnt->is_256color, character_base_addr, tilemap_x, tilemap_y);
        }

        for (int x = 0; x < MAX_TILEMAP_SIZE_X; x++) {
            dbg_tilemap[y][x].r = FIVEBIT_TO_EIGHTBIT_COLOR(line[x].r);
            dbg_tilemap[y][x].g = FIVEBIT_TO_EIGHTBIT_COLOR(line[x].g);
            dbg_tilemap[y][x].b = FIVEBIT_TO_EIGHTBIT_COLOR(line[x].b);
            dbg_tilemap[y][x].a = 0xFF;
        }
    }

    SDL_UpdateTexture(dbg_tilemap_texture, NULL, dbg_tilemap, MAX_TILEMAP_SIZE_X * 4);
}